

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reconinter_sse4.c
# Opt level: O0

void av1_build_compound_diffwtd_mask_sse4_1
               (uint8_t *mask,DIFFWTD_MASK_TYPE mask_type,uint8_t *src0,int stride0,uint8_t *src1,
               int stride1,int h,int w)

{
  uint uVar1;
  undefined1 auVar2 [16];
  ulong uVar3;
  undefined1 auVar4 [16];
  int iVar5;
  undefined8 in_RCX;
  ulong *in_RDX;
  char in_SIL;
  ulong uVar6;
  undefined8 *in_RDI;
  ulong *in_R8;
  int iVar7;
  longlong in_R9;
  undefined8 extraout_XMM0_Qa;
  undefined8 extraout_XMM0_Qa_00;
  undefined8 extraout_XMM0_Qa_01;
  undefined8 extraout_XMM0_Qa_02;
  undefined8 extraout_XMM0_Qb;
  undefined8 extraout_XMM0_Qb_00;
  undefined8 extraout_XMM0_Qb_01;
  undefined8 extraout_XMM0_Qb_02;
  __m128i alVar8;
  __m128i alVar9;
  __m128i mask_base_00;
  __m128i mask_base_01;
  __m128i mask_base_02;
  __m128i s1_00;
  __m128i s1_01;
  __m128i s1_02;
  __m128i s1_03;
  __m128i s0_00;
  __m128i s0_01;
  __m128i s0_02;
  uint in_stack_00000008;
  __m128i m8_2;
  __m128i m16H;
  __m128i m16L;
  __m128i s1H;
  __m128i s0H;
  __m128i s1L;
  __m128i s0L;
  __m128i s1_2;
  __m128i s0_2;
  int j;
  __m128i zero;
  __m128i m8_1;
  __m128i m16_1;
  __m128i s1_1;
  __m128i s0_1;
  __m128i m8;
  __m128i m16;
  __m128i s1;
  __m128i s1AB;
  __m128i s1B;
  __m128i s1A;
  __m128i s0;
  __m128i s0AB;
  __m128i s0B;
  __m128i s0A;
  int i;
  __m128i mask_base;
  int mb;
  int local_3fc;
  undefined1 local_3c8 [16];
  undefined1 local_3b8 [16];
  int local_2fc;
  short local_2e0;
  ulong *local_2d8;
  ulong *local_2c8;
  undefined8 *local_2b8;
  short local_188;
  short sStack_186;
  short sStack_184;
  short sStack_182;
  short sStack_180;
  short sStack_17e;
  short sStack_17c;
  short sStack_17a;
  short local_178;
  short sStack_176;
  short sStack_174;
  short sStack_172;
  short sStack_170;
  short sStack_16e;
  short sStack_16c;
  short sStack_16a;
  short local_158;
  short sStack_156;
  short sStack_154;
  short sStack_152;
  short sStack_150;
  short sStack_14e;
  short sStack_14c;
  short sStack_14a;
  short local_138;
  short sStack_136;
  short sStack_134;
  short sStack_132;
  short sStack_130;
  short sStack_12e;
  short sStack_12c;
  short sStack_12a;
  
  uVar6 = (ulong)in_stack_00000008;
  iVar5 = (int)in_RCX;
  iVar7 = (int)in_R9;
  local_2e0 = (ushort)(in_SIL == '\x01') * 0x40;
  alVar8[1] = CONCAT62((int6)((ulong)in_RCX >> 0x10),local_2e0);
  local_2fc = 0;
  local_2d8 = in_R8;
  local_2c8 = in_RDX;
  local_2b8 = in_RDI;
  if ((int)m8_2[0] == 4) {
    do {
      uVar3 = CONCAT44(*(undefined4 *)((long)local_2c8 + (long)iVar5),(int)*local_2c8);
      auVar4._8_8_ = 0;
      auVar4._0_8_ = uVar3;
      pmovzxbw(auVar4,uVar3);
      s0_00[1] = (long)iVar7;
      uVar3 = CONCAT44(*(undefined4 *)((long)local_2d8 + s0_00[1]),(int)*local_2d8);
      auVar2._8_8_ = 0;
      auVar2._0_8_ = uVar3;
      pmovzxbw(auVar2,uVar3);
      mask_base_00[1] = uVar6;
      mask_base_00[0] = (longlong)in_RDI;
      s1_00[1] = in_R9;
      s1_00[0] = (longlong)in_R8;
      s0_00[0] = (longlong)in_RDX;
      calc_mask(mask_base_00,s0_00,s1_00);
      local_138 = (short)extraout_XMM0_Qa;
      sStack_136 = (short)((ulong)extraout_XMM0_Qa >> 0x10);
      sStack_134 = (short)((ulong)extraout_XMM0_Qa >> 0x20);
      sStack_132 = (short)((ulong)extraout_XMM0_Qa >> 0x30);
      sStack_130 = (short)extraout_XMM0_Qb;
      sStack_12e = (short)((ulong)extraout_XMM0_Qb >> 0x10);
      sStack_12c = (short)((ulong)extraout_XMM0_Qb >> 0x20);
      sStack_12a = (short)((ulong)extraout_XMM0_Qb >> 0x30);
      *(uint *)local_2b8 =
           CONCAT13((0 < sStack_132) * (sStack_132 < 0x100) *
                    (char)((ulong)extraout_XMM0_Qa >> 0x30) - (0xff < sStack_132),
                    CONCAT12((0 < sStack_134) * (sStack_134 < 0x100) *
                             (char)((ulong)extraout_XMM0_Qa >> 0x20) - (0xff < sStack_134),
                             CONCAT11((0 < sStack_136) * (sStack_136 < 0x100) *
                                      (char)((ulong)extraout_XMM0_Qa >> 0x10) - (0xff < sStack_136),
                                      (0 < local_138) * (local_138 < 0x100) * (char)extraout_XMM0_Qa
                                      - (0xff < local_138))));
      uVar1 = CONCAT13((0 < sStack_12a) * (sStack_12a < 0x100) *
                       (char)((ulong)extraout_XMM0_Qb >> 0x30) - (0xff < sStack_12a),
                       CONCAT12((0 < sStack_12c) * (sStack_12c < 0x100) *
                                (char)((ulong)extraout_XMM0_Qb >> 0x20) - (0xff < sStack_12c),
                                CONCAT11((0 < sStack_12e) * (sStack_12e < 0x100) *
                                         (char)((ulong)extraout_XMM0_Qb >> 0x10) -
                                         (0xff < sStack_12e),
                                         (0 < sStack_130) * (sStack_130 < 0x100) *
                                         (char)extraout_XMM0_Qb - (0xff < sStack_130))));
      in_RDX = (ulong *)(ulong)uVar1;
      *(uint *)((long)local_2b8 + 4) = uVar1;
      local_2c8 = (ulong *)((long)local_2c8 + (long)(iVar5 << 1));
      local_2d8 = (ulong *)((long)local_2d8 + (long)(iVar7 << 1));
      local_2b8 = local_2b8 + 1;
      local_2fc = local_2fc + 2;
    } while (local_2fc < (int)in_stack_00000008);
  }
  else if ((int)m8_2[0] == 8) {
    do {
      local_3b8._8_8_ = 0;
      local_3b8._0_8_ = *local_2c8;
      local_3c8._8_8_ = 0;
      local_3c8._0_8_ = *local_2d8;
      pmovzxbw(local_3b8,*local_2c8);
      pmovzxbw(local_3c8,*local_2d8);
      mask_base_01[1] = uVar6;
      mask_base_01[0] = (longlong)in_RDI;
      s1_01[1] = in_R9;
      s1_01[0] = (longlong)in_R8;
      s0_01[1] = alVar8[1];
      s0_01[0] = (longlong)in_RDX;
      alVar8 = calc_mask(mask_base_01,s0_01,s1_01);
      in_RDX = alVar8[1];
      local_158 = (short)extraout_XMM0_Qa_00;
      sStack_156 = (short)((ulong)extraout_XMM0_Qa_00 >> 0x10);
      sStack_154 = (short)((ulong)extraout_XMM0_Qa_00 >> 0x20);
      sStack_152 = (short)((ulong)extraout_XMM0_Qa_00 >> 0x30);
      sStack_150 = (short)extraout_XMM0_Qb_00;
      sStack_14e = (short)((ulong)extraout_XMM0_Qb_00 >> 0x10);
      sStack_14c = (short)((ulong)extraout_XMM0_Qb_00 >> 0x20);
      sStack_14a = (short)((ulong)extraout_XMM0_Qb_00 >> 0x30);
      *local_2b8 = CONCAT17((0 < sStack_14a) * (sStack_14a < 0x100) *
                            (char)((ulong)extraout_XMM0_Qb_00 >> 0x30) - (0xff < sStack_14a),
                            CONCAT16((0 < sStack_14c) * (sStack_14c < 0x100) *
                                     (char)((ulong)extraout_XMM0_Qb_00 >> 0x20) -
                                     (0xff < sStack_14c),
                                     CONCAT15((0 < sStack_14e) * (sStack_14e < 0x100) *
                                              (char)((ulong)extraout_XMM0_Qb_00 >> 0x10) -
                                              (0xff < sStack_14e),
                                              CONCAT14((0 < sStack_150) * (sStack_150 < 0x100) *
                                                       (char)extraout_XMM0_Qb_00 -
                                                       (0xff < sStack_150),
                                                       CONCAT13((0 < sStack_152) *
                                                                (sStack_152 < 0x100) *
                                                                (char)((ulong)extraout_XMM0_Qa_00 >>
                                                                      0x30) - (0xff < sStack_152),
                                                                CONCAT12((0 < sStack_154) *
                                                                         (sStack_154 < 0x100) *
                                                                         (char)((ulong)
                                                  extraout_XMM0_Qa_00 >> 0x20) - (0xff < sStack_154)
                                                  ,CONCAT11((0 < sStack_156) * (sStack_156 < 0x100)
                                                            * (char)((ulong)extraout_XMM0_Qa_00 >>
                                                                    0x10) - (0xff < sStack_156),
                                                            (0 < local_158) * (local_158 < 0x100) *
                                                            (char)extraout_XMM0_Qa_00 -
                                                            (0xff < local_158))))))));
      local_2c8 = (ulong *)((long)local_2c8 + (long)iVar5);
      alVar8[1] = (long)iVar7;
      local_2d8 = (ulong *)((long)local_2d8 + alVar8[1]);
      local_2b8 = local_2b8 + 1;
      local_2fc = local_2fc + 1;
    } while (local_2fc < (int)in_stack_00000008);
  }
  else {
    do {
      local_3fc = 0;
      do {
        alVar8[1] = (long)local_3fc;
        pmovzxbw(*(undefined1 (*) [16])((long)local_2c8 + (long)local_3fc),
                 *(undefined8 *)*(undefined1 (*) [16])((long)local_2c8 + (long)local_3fc));
        pmovzxbw(*(undefined1 (*) [16])((long)local_2d8 + alVar8[1]),
                 *(undefined8 *)*(undefined1 (*) [16])((long)local_2d8 + alVar8[1]));
        alVar9[1] = uVar6;
        alVar9[0] = (longlong)in_RDI;
        s1_02[1] = in_R9;
        s1_02[0] = (longlong)in_R8;
        alVar8[0] = (longlong)in_RDX;
        alVar9 = calc_mask(alVar9,alVar8,s1_02);
        s0_02[0] = alVar9[1];
        mask_base_02[1] = uVar6;
        mask_base_02[0] = (longlong)in_RDI;
        s1_03[1] = in_R9;
        s1_03[0] = (longlong)in_R8;
        s0_02[1] = alVar8[1];
        alVar8 = calc_mask(mask_base_02,s0_02,s1_03);
        in_RDX = alVar8[1];
        local_178 = (short)extraout_XMM0_Qa_01;
        sStack_176 = (short)((ulong)extraout_XMM0_Qa_01 >> 0x10);
        sStack_174 = (short)((ulong)extraout_XMM0_Qa_01 >> 0x20);
        sStack_172 = (short)((ulong)extraout_XMM0_Qa_01 >> 0x30);
        sStack_170 = (short)extraout_XMM0_Qb_01;
        sStack_16e = (short)((ulong)extraout_XMM0_Qb_01 >> 0x10);
        sStack_16c = (short)((ulong)extraout_XMM0_Qb_01 >> 0x20);
        sStack_16a = (short)((ulong)extraout_XMM0_Qb_01 >> 0x30);
        local_188 = (short)extraout_XMM0_Qa_02;
        sStack_186 = (short)((ulong)extraout_XMM0_Qa_02 >> 0x10);
        sStack_184 = (short)((ulong)extraout_XMM0_Qa_02 >> 0x20);
        sStack_182 = (short)((ulong)extraout_XMM0_Qa_02 >> 0x30);
        sStack_180 = (short)extraout_XMM0_Qb_02;
        sStack_17e = (short)((ulong)extraout_XMM0_Qb_02 >> 0x10);
        sStack_17c = (short)((ulong)extraout_XMM0_Qb_02 >> 0x20);
        sStack_17a = (short)((ulong)extraout_XMM0_Qb_02 >> 0x30);
        *(undefined8 *)((long)local_2b8 + (long)local_3fc) =
             CONCAT17((0 < sStack_16a) * (sStack_16a < 0x100) *
                      (char)((ulong)extraout_XMM0_Qb_01 >> 0x30) - (0xff < sStack_16a),
                      CONCAT16((0 < sStack_16c) * (sStack_16c < 0x100) *
                               (char)((ulong)extraout_XMM0_Qb_01 >> 0x20) - (0xff < sStack_16c),
                               CONCAT15((0 < sStack_16e) * (sStack_16e < 0x100) *
                                        (char)((ulong)extraout_XMM0_Qb_01 >> 0x10) -
                                        (0xff < sStack_16e),
                                        CONCAT14((0 < sStack_170) * (sStack_170 < 0x100) *
                                                 (char)extraout_XMM0_Qb_01 - (0xff < sStack_170),
                                                 CONCAT13((0 < sStack_172) * (sStack_172 < 0x100) *
                                                          (char)((ulong)extraout_XMM0_Qa_01 >> 0x30)
                                                          - (0xff < sStack_172),
                                                          CONCAT12((0 < sStack_174) *
                                                                   (sStack_174 < 0x100) *
                                                                   (char)((ulong)extraout_XMM0_Qa_01
                                                                         >> 0x20) -
                                                                   (0xff < sStack_174),
                                                                   CONCAT11((0 < sStack_176) *
                                                                            (sStack_176 < 0x100) *
                                                                            (char)((ulong)
                                                  extraout_XMM0_Qa_01 >> 0x10) - (0xff < sStack_176)
                                                  ,(0 < local_178) * (local_178 < 0x100) *
                                                   (char)extraout_XMM0_Qa_01 - (0xff < local_178))))
                                                ))));
        ((undefined8 *)((long)local_2b8 + (long)local_3fc))[1] =
             CONCAT17((0 < sStack_17a) * (sStack_17a < 0x100) *
                      (char)((ulong)extraout_XMM0_Qb_02 >> 0x30) - (0xff < sStack_17a),
                      CONCAT16((0 < sStack_17c) * (sStack_17c < 0x100) *
                               (char)((ulong)extraout_XMM0_Qb_02 >> 0x20) - (0xff < sStack_17c),
                               CONCAT15((0 < sStack_17e) * (sStack_17e < 0x100) *
                                        (char)((ulong)extraout_XMM0_Qb_02 >> 0x10) -
                                        (0xff < sStack_17e),
                                        CONCAT14((0 < sStack_180) * (sStack_180 < 0x100) *
                                                 (char)extraout_XMM0_Qb_02 - (0xff < sStack_180),
                                                 CONCAT13((0 < sStack_182) * (sStack_182 < 0x100) *
                                                          (char)((ulong)extraout_XMM0_Qa_02 >> 0x30)
                                                          - (0xff < sStack_182),
                                                          CONCAT12((0 < sStack_184) *
                                                                   (sStack_184 < 0x100) *
                                                                   (char)((ulong)extraout_XMM0_Qa_02
                                                                         >> 0x20) -
                                                                   (0xff < sStack_184),
                                                                   CONCAT11((0 < sStack_186) *
                                                                            (sStack_186 < 0x100) *
                                                                            (char)((ulong)
                                                  extraout_XMM0_Qa_02 >> 0x10) - (0xff < sStack_186)
                                                  ,(0 < local_188) * (local_188 < 0x100) *
                                                   (char)extraout_XMM0_Qa_02 - (0xff < local_188))))
                                                ))));
        local_3fc = local_3fc + 0x10;
      } while (local_3fc < (int)m8_2[0]);
      local_2c8 = (ulong *)((long)local_2c8 + (long)iVar5);
      local_2d8 = (ulong *)((long)local_2d8 + (long)iVar7);
      local_2b8 = (undefined8 *)((long)local_2b8 + (long)(int)m8_2[0]);
      local_2fc = local_2fc + 1;
    } while (local_2fc < (int)in_stack_00000008);
  }
  return;
}

Assistant:

void av1_build_compound_diffwtd_mask_sse4_1(uint8_t *mask,
                                            DIFFWTD_MASK_TYPE mask_type,
                                            const uint8_t *src0, int stride0,
                                            const uint8_t *src1, int stride1,
                                            int h, int w) {
  const int mb = (mask_type == DIFFWTD_38_INV) ? AOM_BLEND_A64_MAX_ALPHA : 0;
  const __m128i mask_base = _mm_set1_epi16(38 - mb);
  int i = 0;
  if (4 == w) {
    do {
      const __m128i s0A = _mm_cvtsi32_si128(*(int *)src0);
      const __m128i s0B = _mm_cvtsi32_si128(*(int *)(src0 + stride0));
      const __m128i s0AB = _mm_unpacklo_epi32(s0A, s0B);
      const __m128i s0 = _mm_cvtepu8_epi16(s0AB);

      const __m128i s1A = _mm_cvtsi32_si128(*(int *)src1);
      const __m128i s1B = _mm_cvtsi32_si128(*(int *)(src1 + stride1));
      const __m128i s1AB = _mm_unpacklo_epi32(s1A, s1B);
      const __m128i s1 = _mm_cvtepu8_epi16(s1AB);

      const __m128i m16 = calc_mask(mask_base, s0, s1);
      const __m128i m8 = _mm_packus_epi16(m16, m16);

      *(int *)mask = _mm_cvtsi128_si32(m8);
      *(int *)(mask + w) = _mm_extract_epi32(m8, 1);
      src0 += (stride0 << 1);
      src1 += (stride1 << 1);
      mask += 8;
      i += 2;
    } while (i < h);
  } else if (8 == w) {
    do {
      __m128i s0 = _mm_loadl_epi64((__m128i const *)src0);
      __m128i s1 = _mm_loadl_epi64((__m128i const *)src1);
      s0 = _mm_cvtepu8_epi16(s0);
      s1 = _mm_cvtepu8_epi16(s1);
      const __m128i m16 = calc_mask(mask_base, s0, s1);
      const __m128i m8 = _mm_packus_epi16(m16, m16);
      _mm_storel_epi64((__m128i *)mask, m8);
      src0 += stride0;
      src1 += stride1;
      mask += 8;
      i += 1;
    } while (i < h);
  } else {
    const __m128i zero = _mm_setzero_si128();
    do {
      int j = 0;
      do {
        const __m128i s0 = _mm_load_si128((__m128i const *)(src0 + j));
        const __m128i s1 = _mm_load_si128((__m128i const *)(src1 + j));
        const __m128i s0L = _mm_cvtepu8_epi16(s0);
        const __m128i s1L = _mm_cvtepu8_epi16(s1);
        const __m128i s0H = _mm_unpackhi_epi8(s0, zero);
        const __m128i s1H = _mm_unpackhi_epi8(s1, zero);

        const __m128i m16L = calc_mask(mask_base, s0L, s1L);
        const __m128i m16H = calc_mask(mask_base, s0H, s1H);

        const __m128i m8 = _mm_packus_epi16(m16L, m16H);
        _mm_store_si128((__m128i *)(mask + j), m8);
        j += 16;
      } while (j < w);
      src0 += stride0;
      src1 += stride1;
      mask += w;
      i += 1;
    } while (i < h);
  }
}